

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

basic_message<wchar_t> * booster::locale::gettext<wchar_t>(wchar_t *id,locale *loc)

{
  basic_message<wchar_t> *in_RDI;
  char_type_conflict *in_stack_ffffffffffffff38;
  basic_message<wchar_t> *this;
  
  this = in_RDI;
  basic_message<wchar_t>::basic_message(in_RDI,in_stack_ffffffffffffff38);
  basic_message<wchar_t>::str_abi_cxx11_(this,(locale *)in_RDI);
  basic_message<wchar_t>::~basic_message(in_RDI);
  return in_RDI;
}

Assistant:

std::basic_string<CharType> gettext(CharType const *id,
                                            std::locale const &loc=std::locale())
        {
            return basic_message<CharType>(id).str(loc);
        }